

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall despot::Chain::ComputeOptimalValue(Chain *this,ChainState *state)

{
  undefined8 uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_88;
  int local_84;
  int s_2;
  int nexts;
  double v;
  ACT_TYPE a;
  int s_1;
  double diff;
  int iter;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  int s;
  allocator<despot::ValuedAction> local_31;
  undefined1 local_30 [8];
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  ChainState *state_local;
  Chain *this_local;
  
  policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)state;
  std::allocator<despot::ValuedAction>::allocator(&local_31);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30,5,
             &local_31);
  std::allocator<despot::ValuedAction>::~allocator(&local_31);
  for (next_policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)next_policy.
           super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < 5;
      next_policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                        local_30,(long)(int)next_policy.
                                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined8 *)(pvVar3 + 8) = 0;
  }
  std::allocator<despot::ValuedAction>::allocator
            ((allocator<despot::ValuedAction> *)((long)&diff + 7));
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)&iter,5,
             (allocator<despot::ValuedAction> *)((long)&diff + 7));
  std::allocator<despot::ValuedAction>::~allocator
            ((allocator<despot::ValuedAction> *)((long)&diff + 7));
  diff._0_4_ = 0;
  do {
    for (v._4_4_ = 0; v._4_4_ < 5; v._4_4_ = v._4_4_ + 1) {
      pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          &iter,(long)v._4_4_);
      *(undefined4 *)pvVar3 = 0xffffffff;
      uVar1 = Globals::NEG_INFTY;
      pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          &iter,(long)v._4_4_);
      *(undefined8 *)(pvVar3 + 8) = uVar1;
      for (v._0_4_ = 0; iVar2 = (**(code **)(*(long *)this + 0x28))(), v._0_4_ < iVar2;
          v._0_4_ = v._0_4_ + 1) {
        _s_2 = 0.0;
        for (local_84 = 0; local_84 < 5; local_84 = local_84 + 1) {
          dVar5 = ChainState::GetTransition
                            ((ChainState *)
                             policy.
                             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,v._4_4_,v._0_4_,
                             local_84);
          dVar6 = Reward(this,v._4_4_,v._0_4_,local_84);
          dVar7 = Globals::Discount();
          pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                   operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *
                              )local_30,(long)local_84);
          _s_2 = dVar5 * (dVar7 * *(double *)(pvVar3 + 8) + dVar6) + _s_2;
        }
        pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                            &iter,(long)v._4_4_);
        if (*(double *)(pvVar3 + 8) <= _s_2 && _s_2 != *(double *)(pvVar3 + 8)) {
          pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                   operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *
                              )&iter,(long)v._4_4_);
          *(double *)(pvVar3 + 8) = _s_2;
          pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                   operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *
                              )&iter,(long)v._4_4_);
          *(int *)pvVar3 = v._0_4_;
        }
      }
    }
    _a = 0.0;
    for (local_88 = 0; local_88 < 5; local_88 = local_88 + 1) {
      pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          &iter,(long)local_88);
      dVar5 = *(double *)(pvVar3 + 8);
      pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          local_30,(long)local_88);
      _a = ABS(dVar5 - *(double *)(pvVar3 + 8)) + _a;
      pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          &iter,(long)local_88);
      pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          local_30,(long)local_88);
      *(undefined8 *)pvVar4 = *(undefined8 *)pvVar3;
      *(undefined8 *)(pvVar4 + 8) = *(undefined8 *)(pvVar3 + 8);
    }
    diff._0_4_ = diff._0_4_ + 1;
  } while (0.001 <= _a);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
             (policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),
             (vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)&iter);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30);
  return;
}

Assistant:

void Chain::ComputeOptimalValue(ChainState& state) const {
	vector<ValuedAction> policy = vector<ValuedAction>(NUM_MDP_STATES);
	for (int s = 0; s < NUM_MDP_STATES; s++) {
		policy[s].value = 0;
	}

	vector<ValuedAction> next_policy = vector<ValuedAction>(NUM_MDP_STATES);
	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a < NumActions(); a++) {
				double v = 0;
				for (int nexts = 0; nexts < NUM_MDP_STATES; nexts++) {
					v += state.GetTransition(s, a, nexts)
						* (Reward(s, a, nexts)
							+ Globals::Discount() * policy[nexts].value);
				}

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			diff += fabs(next_policy[s].value - policy[s].value);
			policy[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}

	state.policy = policy;
}